

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ExceptionTranslatorRegistry::registerTranslator
          (ExceptionTranslatorRegistry *this,unique_ptr<Catch::IExceptionTranslator> *translator)

{
  unique_ptr<const_Catch::IExceptionTranslator> local_10;
  
  local_10.m_ptr = translator->m_ptr;
  translator->m_ptr = (IExceptionTranslator *)0x0;
  std::
  vector<Catch::Detail::unique_ptr<Catch::IExceptionTranslator_const>,std::allocator<Catch::Detail::unique_ptr<Catch::IExceptionTranslator_const>>>
  ::emplace_back<Catch::Detail::unique_ptr<Catch::IExceptionTranslator_const>>
            ((vector<Catch::Detail::unique_ptr<Catch::IExceptionTranslator_const>,std::allocator<Catch::Detail::unique_ptr<Catch::IExceptionTranslator_const>>>
              *)&this->m_translators,&local_10);
  if (local_10.m_ptr != (IExceptionTranslator *)0x0) {
    (*(local_10.m_ptr)->_vptr_IExceptionTranslator[1])();
  }
  return;
}

Assistant:

void ExceptionTranslatorRegistry::registerTranslator( Detail::unique_ptr<IExceptionTranslator>&& translator ) {
        m_translators.push_back( CATCH_MOVE( translator ) );
    }